

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerpool.c
# Opt level: O1

workerpool_t * workerpool_create(int nthreads)

{
  int iVar1;
  workerpool_t *__arg;
  zarray_t *pzVar2;
  pthread_t *ppVar3;
  long lVar4;
  
  if (nthreads < 1) {
LAB_00404092:
    __assert_fail("nthreads > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/workerpool.c"
                  ,0x65,"workerpool_t *workerpool_create(int)");
  }
  __arg = (workerpool_t *)calloc(1,0xb8);
  __arg->nthreads = nthreads;
  pzVar2 = (zarray_t *)calloc(1,0x18);
  pzVar2->el_sz = 0x10;
  __arg->tasks = pzVar2;
  if (nthreads != 1) {
    ppVar3 = (pthread_t *)calloc((ulong)(uint)nthreads,8);
    __arg->threads = ppVar3;
    lVar4 = 0;
    pthread_mutex_init((pthread_mutex_t *)&__arg->mutex,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&__arg->startcond,(pthread_condattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&__arg->endcond,(pthread_condattr_t *)0x0);
    do {
      iVar1 = pthread_create((pthread_t *)((long)__arg->threads + lVar4),(pthread_attr_t *)0x0,
                             worker_thread,__arg);
      if (iVar1 != 0) {
        workerpool_create_cold_1();
        goto LAB_00404092;
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)(uint)nthreads << 3 != lVar4);
  }
  return __arg;
}

Assistant:

workerpool_t *workerpool_create(int nthreads)
{
    assert(nthreads > 0);

    workerpool_t *wp = calloc(1, sizeof(workerpool_t));
    wp->nthreads = nthreads;
    wp->tasks = zarray_create(sizeof(struct task));

    if (nthreads > 1) {
        wp->threads = calloc(wp->nthreads, sizeof(pthread_t));

        pthread_mutex_init(&wp->mutex, NULL);
        pthread_cond_init(&wp->startcond, NULL);
        pthread_cond_init(&wp->endcond, NULL);

        for (int i = 0; i < nthreads; i++) {
            int res = pthread_create(&wp->threads[i], NULL, worker_thread, wp);
            if (res != 0) {
                perror("pthread_create");
                exit(-1);
            }
        }
    }

    return wp;
}